

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O0

void __thiscall
crypto_tests::CryptoTest::TestAES256(CryptoTest *this,string *hexkey,string *hexin,string *hexout)

{
  string_view hex_str;
  string_view hex_str_00;
  string_view hex_str_01;
  bool bVar1;
  size_type sVar2;
  unit_test_log_t *this_00;
  lazy_ostream *this_01;
  long in_FS_OFFSET;
  __sv_type _Var3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> correctout;
  vector<unsigned_char,_std::allocator<unsigned_char>_> in;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  AES256Decrypt dec;
  AES256Encrypt enc;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffbf8;
  undefined7 in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc07;
  assertion_result *in_stack_fffffffffffffc08;
  undefined7 in_stack_fffffffffffffc10;
  undefined1 in_stack_fffffffffffffc17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc18;
  undefined7 in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc27;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffc28;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__x;
  const_string *in_stack_fffffffffffffc30;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffffc38;
  size_t in_stack_fffffffffffffc60;
  char *in_stack_fffffffffffffc68;
  const_string local_338 [2];
  lazy_ostream local_318 [2];
  const_string local_2c0 [2];
  lazy_ostream local_2a0 [3];
  const_string local_248 [36];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffc18);
  hex_str._M_str = in_stack_fffffffffffffc68;
  hex_str._M_len = in_stack_fffffffffffffc60;
  ParseHex<unsigned_char>(hex_str);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffc18);
  hex_str_00._M_str = in_stack_fffffffffffffc68;
  hex_str_00._M_len = in_stack_fffffffffffffc60;
  ParseHex<unsigned_char>(hex_str_00);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffc18);
  hex_str_01._M_str = (char *)_Var3._M_len;
  hex_str_01._M_len = in_stack_fffffffffffffc60;
  ParseHex<unsigned_char>(hex_str_01);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbf8);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffbf8);
  if (sVar2 != 0x20) {
    __assert_fail("key.size() == 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
                  ,0x55,
                  "void crypto_tests::CryptoTest::TestAES256(const std::string &, const std::string &, const std::string &)"
                 );
  }
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffbf8);
  if (sVar2 != 0x10) {
    __assert_fail("in.size() == 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
                  ,0x56,
                  "void crypto_tests::CryptoTest::TestAES256(const std::string &, const std::string &, const std::string &)"
                 );
  }
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffbf8);
  if (sVar2 != 0x10) {
    __assert_fail("correctout.size() == 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
                  ,0x57,
                  "void crypto_tests::CryptoTest::TestAES256(const std::string &, const std::string &, const std::string &)"
                 );
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbf8);
  AES256Encrypt::AES256Encrypt((AES256Encrypt *)in_stack_fffffffffffffbf8,(uchar *)0x57f912);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbf8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc18,
             CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbf8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbf8);
  AES256Encrypt::Encrypt
            ((AES256Encrypt *)in_stack_fffffffffffffc08,
             (uchar *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
             (uchar *)in_stack_fffffffffffffbf8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc08,
               (pointer)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
               (unsigned_long)in_stack_fffffffffffffbf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,(size_t)in_stack_fffffffffffffc28
               ,(const_string *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
    std::operator==(in_stack_fffffffffffffc28,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffc08,(bool)in_stack_fffffffffffffc07);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc08,
               (pointer)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
               (unsigned_long)in_stack_fffffffffffffbf8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
               (basic_cstring<const_char> *)in_stack_fffffffffffffbf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc08,
               (pointer)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
               (unsigned_long)in_stack_fffffffffffffbf8);
    in_stack_fffffffffffffbf8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)(local_2a0 + 2),local_2a0,local_2c0,0x5b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffbf8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffbf8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbf8);
  AES256Decrypt::AES256Decrypt((AES256Decrypt *)in_stack_fffffffffffffbf8,(uchar *)0x57fade);
  file = local_248;
  this_00 = (unit_test_log_t *)
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffbf8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbf8);
  AES256Decrypt::Decrypt
            ((AES256Decrypt *)in_stack_fffffffffffffc08,
             (uchar *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
             (uchar *)in_stack_fffffffffffffbf8);
  do {
    __x = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc08,
               (pointer)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
               (unsigned_long)in_stack_fffffffffffffbf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,file,(size_t)__x,
               (const_string *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
    in_stack_fffffffffffffc27 =
         std::operator==(__x,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffc08,(bool)in_stack_fffffffffffffc07);
    this_01 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc08,
               (pointer)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
               (unsigned_long)in_stack_fffffffffffffbf8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
               (basic_cstring<const_char> *)in_stack_fffffffffffffbf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc08,
               (pointer)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
               (unsigned_long)in_stack_fffffffffffffbf8);
    in_stack_fffffffffffffbf8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xfffffffffffffd08,local_318,local_338,0x5e,CHECK,
               CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffbf8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffbf8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  AES256Decrypt::~AES256Decrypt((AES256Decrypt *)this_01);
  AES256Encrypt::~AES256Encrypt((AES256Encrypt *)this_01);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc08);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc08);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc08);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc08);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestAES256(const std::string &hexkey, const std::string &hexin, const std::string &hexout)
{
    std::vector<unsigned char> key = ParseHex(hexkey);
    std::vector<unsigned char> in = ParseHex(hexin);
    std::vector<unsigned char> correctout = ParseHex(hexout);
    std::vector<unsigned char> buf;

    assert(key.size() == 32);
    assert(in.size() == 16);
    assert(correctout.size() == 16);
    AES256Encrypt enc(key.data());
    buf.resize(correctout.size());
    enc.Encrypt(buf.data(), in.data());
    BOOST_CHECK(buf == correctout);
    AES256Decrypt dec(key.data());
    dec.Decrypt(buf.data(), buf.data());
    BOOST_CHECK(buf == in);
}